

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O1

void __thiscall Sampling_SmoothStep_Test::TestBody(Sampling_SmoothStep_Test *this)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float *pfVar11;
  bool bVar12;
  uint uVar13;
  Allocator AVar14;
  byte bVar15;
  char *pcVar16;
  char *in_R9;
  int iVar17;
  uint64_t oldstate_1;
  ulong uVar18;
  uint64_t oldstate;
  undefined1 *puVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar22;
  undefined1 auVar27 [16];
  float fVar23;
  float fVar24;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar44 [12];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float n2_1;
  float fVar37;
  undefined1 auVar38 [64];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  Float t;
  float in_XMM6_Da;
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 in_ZMM14 [64];
  undefined1 auVar43 [16];
  undefined1 in_ZMM17 [64];
  undefined1 in_XMM18 [16];
  span<const_float> f;
  AssertionResult gtest_ar_4;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> values;
  Float dp;
  PiecewiseConstant1D distrib;
  AssertHelper local_110;
  AssertHelper local_108;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_f8;
  float local_d4;
  float fStack_d0;
  undefined4 local_cc;
  undefined1 local_c8 [16];
  float local_b4;
  AssertHelper AStack_b0;
  undefined1 local_a8 [32];
  polymorphic_allocator<float> local_88;
  float *local_80;
  size_t local_78;
  size_t local_70;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  local_c8._8_8_ = local_c8._0_8_;
  local_108.data_ = local_108.data_ & 0xffffffff00000000;
  local_f8.alloc.memoryResource = (memory_resource *)&DAT_3fb999999999999a;
  testing::internal::CmpHelperLT<float,double>
            ((internal *)local_a8,"std::abs(start - 10)",".1",(float *)&local_108,
             (double *)&local_f8);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    std::ostream::_M_insert<double>(10.0);
    if ((float *)local_a8._8_8_ == (float *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)local_a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
               ,0x25c,pcVar16);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_f8.alloc.memoryResource != (memory_resource *)0x0) {
      bVar12 = testing::internal::IsTrue(true);
      if ((bVar12) && (local_f8.alloc.memoryResource != (memory_resource *)0x0)) {
        (*(local_f8.alloc.memoryResource)->_vptr_memory_resource[1])();
      }
      local_f8.alloc.memoryResource = (memory_resource *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_a8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_108.data_ = local_108.data_ & 0xffffffff00000000;
  local_f8.alloc.memoryResource = (memory_resource *)&DAT_3ee4f8b588e368f1;
  testing::internal::CmpHelperLT<float,double>
            ((internal *)local_a8,"std::abs(end - -5)","1e-5",(float *)&local_108,
             (double *)&local_f8);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    std::ostream::_M_insert<double>(-5.0);
    if ((float *)local_a8._8_8_ == (float *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)local_a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
               ,0x25f,pcVar16);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_f8.alloc.memoryResource != (memory_resource *)0x0) {
      bVar12 = testing::internal::IsTrue(true);
      if ((bVar12) && (local_f8.alloc.memoryResource != (memory_resource *)0x0)) {
        (*(local_f8.alloc.memoryResource)->_vptr_memory_resource[1])();
      }
      local_f8.alloc.memoryResource = (memory_resource *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_a8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  auVar41 = ZEXT1664(SUB6416(ZEXT464(0x3f800000),0));
  auVar25 = ZEXT816(0) << 0x40;
  auVar26 = SUB6416(ZEXT464(0x3f000000),0);
  do {
    fVar1 = (auVar41._0_4_ + auVar25._0_4_) * 0.5;
    uVar3 = vcmpss_avx512f(auVar26,auVar41._0_16_,1);
    bVar12 = (bool)((byte)uVar3 & 1);
    uVar3 = vcmpss_avx512f(auVar25,auVar26,1);
    bVar6 = (bool)((byte)uVar3 & 1);
    fVar20 = (float)((uint)bVar6 * ((uint)bVar12 * auVar26._0_4_ + (uint)!bVar12 * (int)fVar1) +
                    (uint)!bVar6 * (int)fVar1);
    auVar29 = ZEXT416((uint)fVar20);
    fVar1 = fVar20 * fVar20;
    auVar26 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar29,ZEXT416(0x40400000));
    fVar37 = fVar1 * auVar26._0_4_;
    uVar4 = vcmpss_avx512f(auVar29,SUB6416(ZEXT464(0x3f800000),0),0xe);
    uVar5 = vcmpss_avx512f(auVar29,ZEXT816(0) << 0x40,1);
    auVar26 = vfmsub231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),ZEXT416((uint)(fVar1 * fVar20)),
                              ZEXT416(0x40000000));
    fVar1 = auVar26._0_4_ + -0.5;
    bVar12 = fVar1 < 0.0;
    fVar21 = (float)((uint)bVar12 * (int)auVar41._0_4_ + (uint)!bVar12 * (int)fVar20);
    auVar25._0_4_ = (float)((uint)bVar12 * (int)fVar20 + (uint)!bVar12 * (int)auVar25._0_4_);
    auVar26._8_4_ = 0x7fffffff;
    auVar26._0_8_ = 0x7fffffff7fffffff;
    auVar26._12_4_ = 0x7fffffff;
    auVar26 = vandps_avx512vl(ZEXT416((uint)fVar1),auVar26);
    uVar3 = vcmpps_avx512vl(auVar26,SUB6416(ZEXT464(0x358637bd),0),5);
    uVar2 = vcmpps_avx512vl(ZEXT416((uint)(fVar21 - auVar25._0_4_)),SUB6416(ZEXT464(0x358637bd),0),5
                           );
    bVar12 = (bool)((byte)uVar3 & (byte)uVar2 & 1);
    auVar26 = ZEXT416((uint)bVar12 *
                      (int)(fVar20 - fVar1 / (float)((uint)!(bool)((byte)uVar5 & 1) *
                                                    (uint)!(bool)((byte)uVar4 & 1) *
                                                    (int)(fVar37 + fVar37))) +
                      (uint)!bVar12 * (int)fVar20);
    in_XMM6_Da = (float)((uint)bVar12 * (int)in_XMM6_Da + (uint)!bVar12 * (int)fVar20);
    auVar41 = ZEXT464((uint)fVar21);
  } while (bVar12 != false);
  local_c8._0_8_ = (double)in_XMM6_Da;
  auVar29._8_4_ = 0xffffffff;
  auVar29._0_8_ = 0x7fffffffffffffff;
  auVar29._12_4_ = 0x7fffffff;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = (double)in_XMM6_Da + -0.733615;
  auVar26 = vandpd_avx512vl(auVar35,auVar29);
  local_f8.alloc.memoryResource = (memory_resource *)vmovlpd_avx(auVar26);
  local_108.data_ = (AssertHelperData *)&DAT_3ee4f8b588e368f1;
  testing::internal::CmpHelperLT<double,double>
            ((internal *)local_a8,"std::abs(mid - 0.733615)","1e-5",(double *)&local_f8,
             (double *)&local_108);
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_f8);
    std::ostream::_M_insert<double>((double)local_c8._0_8_);
    if ((float *)local_a8._8_8_ == (float *)0x0) {
      pcVar16 = "";
    }
    else {
      pcVar16 = *(char **)local_a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
               ,0x263,pcVar16);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    if (local_f8.alloc.memoryResource != (memory_resource *)0x0) {
      bVar12 = testing::internal::IsTrue(true);
      if ((bVar12) && (local_f8.alloc.memoryResource != (memory_resource *)0x0)) {
        (*(local_f8.alloc.memoryResource)->_vptr_memory_resource[1])();
      }
      local_f8.alloc.memoryResource = (memory_resource *)0x0;
    }
  }
  iVar17 = 0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_a8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  puVar19 = &DAT_5851f42d4c957f2e;
  do {
    uVar13 = (uint)((ulong)puVar19 >> 0x2d) ^ (uint)((ulong)puVar19 >> 0x1b);
    bVar15 = (byte)((ulong)puVar19 >> 0x3b);
    auVar26 = vcvtusi2ss_avx512f(in_ZMM14._0_16_,uVar13 >> bVar15 | uVar13 << 0x20 - bVar15);
    local_cc = auVar26._0_4_ * 2.3283064e-10;
    auVar26 = vminss_avx(ZEXT416((uint)local_cc),ZEXT416(0x3f7fffff));
    fVar37 = auVar26._0_4_;
    local_c8._0_4_ = fVar37;
    fVar1 = 0.0 - fVar37;
    auVar43._8_4_ = 0x7fffffff;
    auVar43._0_8_ = 0x7fffffff7fffffff;
    auVar43._12_4_ = 0x7fffffff;
    auVar26 = vandps_avx512vl(ZEXT416((uint)fVar1),auVar43);
    auVar25 = SUB6416(ZEXT464(0xc0400000),0);
    if (1e-06 <= auVar26._0_4_) {
      auVar30._8_4_ = 0x7fffffff;
      auVar30._0_8_ = 0x7fffffff7fffffff;
      auVar30._12_4_ = 0x7fffffff;
      auVar26 = vandps_avx512vl(ZEXT416((uint)(1.0 - fVar37)),auVar30);
      auVar41 = ZEXT464(0x358637bd);
      auVar25 = SUB6416(ZEXT464(0x40a00000),0);
      if (1e-06 <= auVar26._0_4_) {
        auVar38 = ZEXT464(0xc0400000);
        fVar20 = (fVar1 * -8.0) / ((1.0 - fVar37) - fVar1) + -3.0;
        auVar40 = ZEXT464(0x40a00000);
        do {
          fVar21 = (auVar40._0_4_ + auVar38._0_4_) * 0.5;
          uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar20),auVar40._0_16_,1);
          bVar12 = (bool)((byte)uVar3 & 1);
          uVar3 = vcmpss_avx512f(auVar38._0_16_,ZEXT416((uint)fVar20),1);
          bVar6 = (bool)((byte)uVar3 & 1);
          fVar22 = (float)((uint)bVar6 * ((uint)bVar12 * (int)fVar20 + (uint)!bVar12 * (int)fVar21)
                          + (uint)!bVar6 * (int)fVar21);
          fVar20 = (fVar22 + 3.0) * 0.125;
          fVar21 = 0.0;
          if ((-3.0 <= fVar22) && (fVar22 <= 5.0)) {
            auVar26 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fVar20));
            uVar3 = vcmpss_avx512f(ZEXT416((uint)fVar20),ZEXT816(0) << 0x40,1);
            fVar21 = (float)((uint)!(bool)((byte)uVar3 & 1) * auVar26._0_4_);
            auVar27._4_12_ = auVar26._4_12_;
            auVar27._0_4_ = fVar21;
            auVar26 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar27,ZEXT416(0x40400000));
            fVar21 = auVar26._0_4_ * fVar21 * fVar21 * 0.25;
          }
          fVar23 = fVar20 * fVar20;
          auVar26 = vfmsub231ss_fma(ZEXT416((uint)(fVar23 * fVar23)),
                                    ZEXT416((uint)(fVar20 * fVar23)),ZEXT416(0x40000000));
          fVar20 = auVar26._0_4_ - fVar37;
          uVar3 = vcmpps_avx512vl(ZEXT416((uint)fVar20),ZEXT816(0) << 0x20,5);
          uVar2 = vcmpps_avx512vl(ZEXT416((uint)fVar1),ZEXT816(0) << 0x20,1);
          bVar15 = (byte)uVar2 ^ (byte)uVar3;
          fVar23 = (float)((uint)(bVar15 & 1) * (int)auVar40._0_4_ +
                          (uint)!(bool)(bVar15 & 1) * (int)fVar22);
          fVar24 = (float)((uint)(bVar15 & 1) * (int)fVar22 +
                          (uint)!(bool)(bVar15 & 1) * (int)auVar38._0_4_);
          auVar38 = ZEXT1664(CONCAT124(auVar38._4_12_,fVar24));
          auVar7._8_4_ = 0x7fffffff;
          auVar7._0_8_ = 0x7fffffff7fffffff;
          auVar7._12_4_ = 0x7fffffff;
          auVar26 = vandps_avx512vl(ZEXT416((uint)fVar20),auVar7);
          uVar3 = vcmpps_avx512vl(auVar26,SUB6416(ZEXT464(0x358637bd),0),5);
          uVar2 = vcmpps_avx512vl(ZEXT416((uint)(fVar23 - fVar24)),SUB6416(ZEXT464(0x358637bd),0),5)
          ;
          bVar12 = (bool)((byte)uVar3 & (byte)uVar2 & 1);
          fVar20 = (float)((uint)bVar12 * (int)(fVar22 - fVar20 / fVar21) +
                          (uint)!bVar12 * (int)fVar22);
          auVar25 = ZEXT416((uint)bVar12 * auVar41._0_4_ + (uint)!bVar12 * (int)fVar22);
          auVar40 = ZEXT464((uint)fVar23);
          auVar41 = ZEXT1664(auVar25);
        } while (bVar12 != false);
      }
    }
    fStack_d0 = (auVar25._0_4_ + 3.0) * 0.125;
    auVar26 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)fStack_d0));
    uVar3 = vcmpss_avx512f(ZEXT416((uint)fStack_d0),ZEXT816(0) << 0x40,1);
    fVar1 = (float)((uint)!(bool)((byte)uVar3 & 1) * auVar26._0_4_);
    auVar28._4_12_ = auVar26._4_12_;
    auVar28._0_4_ = fVar1;
    auVar26 = vfmadd132ss_fma(auVar28,SUB6416(ZEXT464(0x40400000),0),ZEXT416(0xc0000000));
    fVar1 = fVar1 * fVar1 * auVar26._0_4_;
    uVar3 = vcmpss_avx512f(auVar25,ZEXT416(0x40a00000),0xe);
    uVar2 = vcmpss_avx512f(auVar25,ZEXT416(0xc0400000),1);
    local_d4 = fVar1 / (float)((uint)!(bool)((byte)uVar2 & 1) *
                              (uint)!(bool)((byte)uVar3 & 1) * (int)(fVar1 * 0.25));
    auVar8._8_4_ = 0x7fffffff;
    auVar8._0_8_ = 0x7fffffff7fffffff;
    auVar8._12_4_ = 0x7fffffff;
    auVar26 = vandps_avx512vl(ZEXT416((uint)(local_d4 + -4.0)),auVar8);
    local_108.data_._0_4_ = auVar26._0_4_;
    local_f8.alloc.memoryResource = (memory_resource *)&DAT_3ee4f8b588e368f1;
    testing::internal::CmpHelperLT<float,double>
              ((internal *)local_a8,"std::abs(ratio - 4)","1e-5",(float *)&local_108,
               (double *)&local_f8);
    if (local_a8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_f8);
      std::ostream::_M_insert<double>((double)local_d4);
      pcVar16 = "";
      if ((float *)local_a8._8_8_ != (float *)0x0) {
        pcVar16 = *(char **)local_a8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x269,pcVar16);
      testing::internal::AssertHelper::operator=(&local_108,(Message *)&local_f8);
      testing::internal::AssertHelper::~AssertHelper(&local_108);
      if (local_f8.alloc.memoryResource != (memory_resource *)0x0) {
        bVar12 = testing::internal::IsTrue(true);
        if ((bVar12) && (local_f8.alloc.memoryResource != (memory_resource *)0x0)) {
          (*(local_f8.alloc.memoryResource)->_vptr_memory_resource[1])();
        }
        local_f8.alloc.memoryResource = (memory_resource *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_a8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         );
    fVar1 = fStack_d0 * fStack_d0;
    auVar26 = vfmsub231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),ZEXT416((uint)(fStack_d0 * fVar1)),
                              ZEXT416(0x40000000));
    fVar1 = auVar26._0_4_ - auVar26._0_4_;
    auVar36._0_4_ = fVar1 / fVar1;
    auVar36._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar25 = vminss_avx(ZEXT416((uint)local_cc),ZEXT416(0x3f7fffff));
    auVar39._8_4_ = 0x7fffffff;
    auVar39._0_8_ = 0x7fffffff7fffffff;
    auVar39._12_4_ = 0x7fffffff;
    auVar26 = vandps_avx(auVar36,auVar39);
    auVar26 = vminss_avx(auVar26,auVar25);
    bVar12 = auVar26._0_4_ < 0.01;
    fVar1 = (float)local_c8._0_4_ - auVar36._0_4_;
    auVar26 = vandps_avx(ZEXT416((uint)bVar12 * (int)fVar1 +
                                 (uint)!bVar12 *
                                 (int)((fVar1 + fVar1) / ((float)local_c8._0_4_ + auVar36._0_4_))),
                         auVar39);
    local_f8.alloc.memoryResource._0_1_ = auVar26._0_4_ <= 0.01;
    local_f8.ptr = (float *)0x0;
    if (0.01 < auVar26._0_4_) {
      testing::Message::Message((Message *)&local_108);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_a8,(internal *)&local_f8,
                 (AssertionResult *)"checkErr(u, InvertSmoothStepSample(x, -3, 5))","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_110,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x273,(char *)CONCAT71(local_a8._1_7_,local_a8[0]));
      testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_110);
      if ((undefined1 *)CONCAT71(local_a8._1_7_,local_a8[0]) != local_a8 + 0x10) {
        operator_delete((undefined1 *)CONCAT71(local_a8._1_7_,local_a8[0]),local_a8._16_8_ + 1);
      }
      if (local_108.data_ != (AssertHelperData *)0x0) {
        bVar12 = testing::internal::IsTrue(true);
        if ((bVar12) && (local_108.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_108.data_ + 8))();
        }
        local_108.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_f8.ptr,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    ;
    puVar19 = (undefined1 *)((long)puVar19 * 0x5851f42d4c957f2d + 1);
    iVar17 = iVar17 + 1;
  } while (iVar17 != 1000);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp:630:15)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp:630:15)>
             ::_M_manager;
  AVar14.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::Sample1DFunction
            (&local_f8,(function<float_(float)> *)&local_58,0x400,0x10000,0.0,1.0,AVar14);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  pfVar11 = local_f8.ptr;
  AVar14.memoryResource = pstd::pmr::new_delete_resource();
  f.n = local_f8.nStored;
  f.ptr = pfVar11;
  pbrt::PiecewiseConstant1D::PiecewiseConstant1D((PiecewiseConstant1D *)local_a8,f,0.0,1.0,AVar14);
  iVar17 = 0;
  uVar18 = 0xfffe179e76d83e92;
  do {
    uVar13 = (uint)(uVar18 >> 0x2d) ^ (uint)(uVar18 >> 0x1b);
    bVar15 = (byte)(uVar18 >> 0x3b);
    auVar26 = vcvtusi2ss_avx512f(in_XMM18,uVar13 >> bVar15 | uVar13 << 0x20 - bVar15);
    auVar25 = vminss_avx(ZEXT416((uint)(auVar26._0_4_ * 2.3283064e-10)),ZEXT416(0x3f7fffff));
    auVar26 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
    in_ZMM17 = ZEXT1664(auVar26);
    auVar29 = vsubss_avx512f(auVar26,auVar25);
    auVar42._8_4_ = 0x7fffffff;
    auVar42._0_8_ = 0x7fffffff7fffffff;
    auVar42._12_4_ = 0x7fffffff;
    auVar26 = vandps_avx(auVar42,auVar29);
    auVar35 = ZEXT816(0) << 0x40;
    auVar43 = ZEXT416(0x3f800000);
    if (1e-06 <= auVar26._0_4_) {
      auVar30 = vsubss_avx512f(ZEXT416(0x3f800000),auVar25);
      auVar26 = vandps_avx(auVar42,auVar30);
      in_ZMM17 = ZEXT1664(ZEXT416(0x3f800000));
      if (1e-06 <= auVar26._0_4_) {
        auVar34._0_4_ = auVar29._0_4_ / (auVar30._0_4_ - auVar29._0_4_);
        auVar34._4_12_ = auVar29._4_12_;
        auVar33._0_12_ = ZEXT812(0);
        auVar33._12_4_ = 0;
        auVar41 = ZEXT464((uint)(0.0 - auVar34._0_4_));
        auVar32 = auVar43;
        do {
          auVar26 = vmulss_avx512f(ZEXT416((uint)(auVar32._0_4_ + auVar33._0_4_)),
                                   SUB6416(ZEXT464(0x3f000000),0));
          uVar3 = vcmpss_avx512f(auVar41._0_16_,auVar32,1);
          bVar12 = (bool)((byte)uVar3 & 1);
          register0x00000900 = auVar26._4_12_;
          uVar3 = vcmpss_avx512f(auVar33,auVar41._0_16_,1);
          bVar6 = (bool)((byte)uVar3 & 1);
          auVar31._0_4_ =
               (uint)bVar6 * ((uint)bVar12 * auVar41._0_4_ + (uint)!bVar12 * auVar26._0_4_) +
               (uint)!bVar6 * auVar26._0_4_;
          auVar26 = vmulss_avx512f(auVar31,auVar31);
          auVar30 = vfmadd213ss_avx512f(SUB6416(ZEXT464(0xc0000000),0),auVar31,
                                        SUB6416(ZEXT464(0x40400000),0));
          fVar37 = auVar26._0_4_;
          fVar1 = fVar37 * auVar30._0_4_;
          uVar4 = vcmpss_avx512f(auVar31,auVar43,0xe);
          uVar5 = vcmpss_avx512f(auVar31,auVar35,1);
          auVar26 = vmulss_avx512f(auVar31,auVar26);
          auVar26 = vfmsub231ss_fma(ZEXT416((uint)(fVar37 * fVar37)),auVar26,
                                    SUB6416(ZEXT464(0x40000000),0));
          fVar37 = auVar26._0_4_ - auVar25._0_4_;
          uVar3 = vcmpps_avx512vl(ZEXT416((uint)fVar37),auVar35,5);
          uVar2 = vcmpps_avx512vl(auVar29,auVar35,1);
          bVar15 = (byte)uVar2 ^ (byte)uVar3;
          auVar32._0_4_ =
               (float)((uint)(bVar15 & 1) * (int)auVar32._0_4_ +
                      (uint)!(bool)(bVar15 & 1) * auVar31._0_4_);
          auVar32._4_12_ = register0x00000900;
          auVar33._0_4_ =
               (float)((uint)(bVar15 & 1) * auVar31._0_4_ +
                      (uint)!(bool)(bVar15 & 1) * (int)auVar33._0_4_);
          auVar26 = vandps_avx(auVar42,ZEXT416((uint)fVar37));
          uVar3 = vcmpps_avx512vl(auVar26,SUB6416(ZEXT464(0x358637bd),0),5);
          uVar2 = vcmpps_avx512vl(ZEXT416((uint)(auVar32._0_4_ - auVar33._0_4_)),
                                  SUB6416(ZEXT464(0x358637bd),0),5);
          bVar12 = (bool)((byte)uVar3 & (byte)uVar2 & 1);
          auVar26 = vsubss_avx512f(auVar31,ZEXT416((uint)(fVar37 / (float)((uint)!(bool)((byte)uVar5
                                                                                        & 1) *
                                                                          (uint)!(bool)((byte)uVar4
                                                                                       & 1) *
                                                                          (int)(fVar1 + fVar1)))));
          auVar26 = CONCAT124(register0x00000900,
                              (uint)bVar12 * auVar26._0_4_ + (uint)!bVar12 * auVar31._0_4_);
          auVar41 = ZEXT1664(auVar26);
          auVar34._0_4_ = (float)((uint)bVar12 * auVar34._0_4_ + (uint)!bVar12 * auVar31._0_4_);
          auVar34._4_12_ = register0x00000900;
          in_ZMM17 = ZEXT1664(auVar34);
        } while (bVar12 != false);
      }
    }
    local_c8 = in_ZMM17._0_16_;
    auVar26 = vfmadd213ss_avx512f(SUB6416(ZEXT464(0xc0000000),0),local_c8,
                                  SUB6416(ZEXT464(0x40400000),0));
    fStack_d0 = auVar26._0_4_;
    uVar3 = vcmpss_avx512f(local_c8,auVar43,0xe);
    local_cc = (float)(CONCAT22(local_cc._2_2_,(short)uVar3) & 0xffff0001);
    local_d4 = pbrt::PiecewiseConstant1D::Sample
                         ((PiecewiseConstant1D *)local_a8,auVar25._0_4_,&local_b4,(int *)0x0);
    auVar9._8_4_ = 0x7fffffff;
    auVar9._0_8_ = 0x7fffffff7fffffff;
    auVar9._12_4_ = 0x7fffffff;
    auVar26 = vandps_avx512vl(ZEXT416((uint)((float)local_c8._0_4_ - local_d4)),auVar9);
    AStack_b0.data_._0_4_ = auVar26._0_4_;
    local_110.data_ = (AssertHelperData *)&DAT_3f689374bc6a7efa;
    testing::internal::CmpHelperLT<float,double>
              ((internal *)&local_108,"std::abs(cx - dx)","3e-3",(float *)&AStack_b0,
               (double *)&local_110);
    if (local_108.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_110);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_110.data_)->line,"Closed form = ",0xe);
      auVar26 = vcvtss2sd_avx512f(in_XMM18,ZEXT416((uint)local_c8._0_4_));
      std::ostream::_M_insert<double>(auVar26._0_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_110.data_)->line,", distrib = ",0xc);
      auVar26 = vcvtss2sd_avx512f(in_XMM18,ZEXT416((uint)local_d4));
      std::ostream::_M_insert<double>(auVar26._0_8_);
      pcVar16 = "";
      if (local_100.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar16 = ((local_100.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x27f,pcVar16);
      testing::internal::AssertHelper::operator=(&AStack_b0,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&AStack_b0);
      if (local_110.data_ != (AssertHelperData *)0x0) {
        bVar12 = testing::internal::IsTrue(true);
        if ((bVar12) && (local_110.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_110.data_ + 8))();
        }
        local_110.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_100,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    fVar1 = local_c8._0_4_ * local_c8._0_4_ * fStack_d0;
    uVar3 = vcmpss_avx512f(local_c8,ZEXT816(0),1);
    fVar1 = (float)((uint)!(bool)((byte)uVar3 & 1) *
                   (uint)!(bool)(SUB41(local_cc,0) & 1) * (int)(fVar1 + fVar1));
    local_c8 = ZEXT416((uint)fVar1);
    auVar10._8_4_ = 0x7fffffff;
    auVar10._0_8_ = 0x7fffffff7fffffff;
    auVar10._12_4_ = 0x7fffffff;
    auVar26 = vandps_avx512vl(ZEXT416((uint)(fVar1 - local_b4)),auVar10);
    AStack_b0.data_._0_4_ = auVar26._0_4_;
    local_110.data_ = (AssertHelperData *)&DAT_3f689374bc6a7efa;
    testing::internal::CmpHelperLT<float,double>
              ((internal *)&local_108,"std::abs(cp - dp)","3e-3",(float *)&AStack_b0,
               (double *)&local_110);
    if (local_108.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_110);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_110.data_)->line,"Closed form PDF = ",0x12);
      auVar26 = vcvtss2sd_avx512f(in_XMM18,ZEXT416((uint)local_c8._0_4_));
      std::ostream::_M_insert<double>(auVar26._0_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&(local_110.data_)->line,", distrib PDF = ",0x10);
      auVar26 = vcvtss2sd_avx512f(in_XMM18,ZEXT416((uint)local_b4));
      std::ostream::_M_insert<double>(auVar26._0_8_);
      pcVar16 = "";
      if (local_100.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar16 = ((local_100.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&AStack_b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x281,pcVar16);
      testing::internal::AssertHelper::operator=(&AStack_b0,(Message *)&local_110);
      testing::internal::AssertHelper::~AssertHelper(&AStack_b0);
      if (local_110.data_ != (AssertHelperData *)0x0) {
        bVar12 = testing::internal::IsTrue(true);
        if ((bVar12) && (local_110.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_110.data_ + 8))();
        }
        local_110.data_ = (AssertHelperData *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_100,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar18 = uVar18 * 0x5851f42d4c957f2d + 0x1e71f;
    iVar17 = iVar17 + 1;
  } while (iVar17 != 100);
  local_70 = 0;
  (*(local_88.memoryResource)->_vptr_memory_resource[3])
            (local_88.memoryResource,local_80,local_78 << 2,4);
  local_a8._24_8_ = 0;
  (**(code **)(*(long *)CONCAT71(local_a8._1_7_,local_a8[0]) + 0x18))
            ((long *)CONCAT71(local_a8._1_7_,local_a8[0]),local_a8._8_8_,local_a8._16_8_ << 2,4);
  local_f8.nStored = 0;
  (*(local_f8.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_f8.alloc.memoryResource,local_f8.ptr,local_f8.nAlloc << 2,4);
  return;
}

Assistant:

TEST(Sampling, SmoothStep) {
    Float start = SampleSmoothStep(0, 10, 20);
    // Fairly high slop since lots of values close to the start are close
    // to zero.
    EXPECT_LT(std::abs(start - 10), .1) << start;

    Float end = SampleSmoothStep(1, -10, -5);
    EXPECT_LT(std::abs(end - -5), 1e-5) << end;

    Float mid = SampleSmoothStep(0.5, 0, 1);
    // Solved this numericalla in Mathematica.
    EXPECT_LT(std::abs(mid - 0.733615), 1e-5) << mid;

    for (Float u : Uniform1D(1000)) {
        Float x = SampleSmoothStep(u, -3, 5);
        Float ratio = SmoothStep(x, -3, 5) / SmoothStepPDF(x, -3, 5);
        // SmoothStep over [-3,5] integrates to 4.
        EXPECT_LT(std::abs(ratio - 4), 1e-5) << ratio;

        auto checkErr = [](Float a, Float b) {
            Float err;
            if (std::min(std::abs(a), std::abs(b)) < 1e-2)
                err = std::abs(a - b);
            else
                err = std::abs(2 * (a - b) / (a + b));
            return err > 1e-2;
        };
        EXPECT_FALSE(checkErr(u, InvertSmoothStepSample(x, -3, 5)));
    }

    auto ss = [](Float v) { return SmoothStep(v, 0, 1); };
    auto values = Sample1DFunction(ss, 1024, 64 * 1024, 0.f, 1.f);
    PiecewiseConstant1D distrib(values);
    for (Float u : Uniform1D(100, 62351)) {
        Float cx = SampleSmoothStep(u, 0, 1);
        Float cp = SmoothStepPDF(cx, 0, 1);

        Float dp;
        Float dx = distrib.Sample(u, &dp);
        EXPECT_LT(std::abs(cx - dx), 3e-3)
            << "Closed form = " << cx << ", distrib = " << dx;
        EXPECT_LT(std::abs(cp - dp), 3e-3)
            << "Closed form PDF = " << cp << ", distrib PDF = " << dp;
    }
}